

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::consumeMessage<6u,unsigned_char>
               (uchar payLength,char **src,uint *length,WebSocketState<true> *wState,void *user)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  byte in_DIL;
  bool fin;
  WebSocketState<true> *in_stack_00000178;
  bool in_stack_00000187;
  int in_stack_00000188;
  uint in_stack_0000018c;
  size_t in_stack_00000190;
  char *in_stack_00000198;
  void *in_stack_000001b0;
  void *in_stack_ffffffffffffffb8;
  WebSocketState<true> *in_stack_ffffffffffffffc0;
  WebSocketState<true> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  uVar1 = WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::getOpCode((char *)*in_RSI);
  if (uVar1 == '\0') {
    if ((char)(*in_RCX << 1) >> 6 == -1) {
      WebSocketContext<true,_true>::forceClose(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return true;
    }
  }
  else {
    if (((char)(*in_RCX << 1) >> 6 == '\x01') ||
       ((-1 < (char)*in_RCX &&
        (bVar2 = WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::getOpCode
                           ((char *)*in_RSI), bVar2 < 2)))) {
      WebSocketContext<true,_true>::forceClose(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return true;
    }
    bVar2 = WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::getOpCode((char *)*in_RSI);
    bVar4 = ((char)(*in_RCX << 1) >> 6) + 1U & 3;
    *in_RCX = *in_RCX & 0x9f | bVar4 << 5;
    in_RCX[(long)(int)((char)(bVar4 << 6) >> 6) + 0xe] = bVar2;
  }
  bVar3 = WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::isFin((char *)*in_RSI);
  *in_RCX = *in_RCX & 0x7f | bVar3 << 7;
  bVar3 = WebSocketContext<true,_true>::refusePayloadLength
                    (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (bVar3) {
    WebSocketContext<true,_true>::forceClose(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_1 = true;
  }
  else if (*in_RDX < in_DIL + 6) {
    *in_RCX = *in_RCX & 0xe1;
    *in_RCX = *in_RCX & 0xfe;
    *(uint *)(in_RCX + 0x10) = ((uint)in_DIL - *in_RDX) + 6;
    WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::isFin((char *)*in_RSI);
    *(undefined4 *)(in_RCX + 0x14) = *(undefined4 *)(*in_RSI + 2);
    WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::unmaskImprecise
              ((char *)*in_RSI,(char *)(*in_RSI + 6),(char *)(in_RCX + 0x14),*in_RDX - 6);
    WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::rotateMask
              (4 - (*in_RDX - 6 & 3),(char *)(in_RCX + 0x14));
    WebSocketContext<true,_true>::handleFragment
              (in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000188,
               in_stack_00000187,in_stack_00000178,in_stack_000001b0);
    local_1 = true;
  }
  else {
    WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::unmaskImpreciseCopyMask
              ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
               (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::isFin((char *)*in_RSI);
    bVar3 = WebSocketContext<true,_true>::handleFragment
                      (in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000188,
                       in_stack_00000187,in_stack_00000178,in_stack_000001b0);
    if (bVar3) {
      local_1 = true;
    }
    else {
      bVar3 = WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::isFin((char *)*in_RSI);
      if (bVar3) {
        *in_RCX = *in_RCX & 0x9f | (((char)(*in_RCX << 1) >> 6) - 1U & 3) << 5;
      }
      *in_RSI = *in_RSI + (ulong)(in_DIL + 6);
      *in_RDX = *in_RDX - (in_DIL + 6);
      *in_RCX = *in_RCX & 0xe1;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }